

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantValue * __thiscall slang::ConstantValue::convertToStr(ConstantValue *this)

{
  bool bVar1;
  bitwidth_t bVar2;
  bitwidth_t bVar3;
  SVInt *this_00;
  uchar *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  optional<unsigned_char> c_1;
  optional<unsigned_char> c;
  string result;
  int32_t extraBits;
  int32_t msb;
  SVInt *val;
  _Optional_payload_base<unsigned_char> in_stack_ffffffffffffff68;
  _Optional_payload_base<unsigned_char> in_stack_ffffffffffffff6a;
  undefined4 in_stack_ffffffffffffff6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  SVInt *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  int local_1c;
  
  pbVar5 = in_RDI;
  bVar1 = isString((ConstantValue *)0x335506);
  if (bVar1) {
    ConstantValue((ConstantValue *)in_RDI,
                  (ConstantValue *)
                  CONCAT44(in_stack_ffffffffffffff6c,
                           CONCAT22(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68)));
  }
  else {
    bVar1 = isInteger((ConstantValue *)0x33552a);
    if (bVar1) {
      this_00 = integer((ConstantValue *)0x33554b);
      bVar2 = SVInt::getBitWidth(this_00);
      local_1c = bVar2 - 1;
      bVar2 = SVInt::getBitWidth(this_00);
      std::__cxx11::string::string(in_RSI);
      bVar3 = SVInt::getBitWidth(this_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      if ((bVar2 & 7) != 0) {
        SVInt::slice(_extraBits,result.field_2._12_4_,result.field_2._8_4_);
        in_stack_ffffffffffffff6a =
             (_Optional_payload_base<unsigned_char>)
             SVInt::as<unsigned_char>(in_stack_ffffffffffffff88);
        SVInt::~SVInt((SVInt *)in_RSI);
        bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_char> *)0x33560b);
        if ((bVar1) &&
           (puVar4 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)0x33561b),
           *puVar4 != '\0')) {
          std::optional<unsigned_char>::operator*((optional<unsigned_char> *)0x33562a);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (in_RSI,(char)((ulong)pbVar5 >> 0x38));
        }
        local_1c = local_1c - (bVar2 & 7);
      }
      for (; 6 < local_1c; local_1c = local_1c + -8) {
        SVInt::slice(_extraBits,result.field_2._12_4_,result.field_2._8_4_);
        in_stack_ffffffffffffff68 =
             (_Optional_payload_base<unsigned_char>)
             SVInt::as<unsigned_char>(in_stack_ffffffffffffff88);
        SVInt::~SVInt((SVInt *)in_RSI);
        bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_char> *)0x3356d0);
        if ((bVar1) &&
           (puVar4 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)0x3356e0),
           *puVar4 != '\0')) {
          std::optional<unsigned_char>::operator*((optional<unsigned_char> *)0x3356ef);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (in_RSI,(char)((ulong)pbVar5 >> 0x38));
        }
      }
      ConstantValue((ConstantValue *)in_RDI,
                    (string *)
                    CONCAT44(bVar3,CONCAT22(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68)));
      std::__cxx11::string::~string(in_RDI);
    }
    else {
      ConstantValue((ConstantValue *)in_RDI,
                    (nullptr_t)
                    CONCAT44(in_stack_ffffffffffffff6c,
                             CONCAT22(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68)));
    }
  }
  return (ConstantValue *)pbVar5;
}

Assistant:

ConstantValue ConstantValue::convertToStr() const {
    if (isString())
        return *this;

    if (!isInteger())
        return nullptr;

    // Conversion is described in [6.16]: take each 8 bit chunk,
    // remove it if it's zero, otherwise add as character to the string.

    const SVInt& val = integer();
    int32_t msb = int32_t(val.getBitWidth() - 1);
    int32_t extraBits = int32_t(val.getBitWidth() % 8);

    std::string result;
    result.reserve((val.getBitWidth() + 7) / 8);
    if (extraBits) {
        auto c = val.slice(msb, msb - extraBits + 1).as<uint8_t>();
        if (c && *c)
            result.push_back(char(*c));
        msb -= extraBits;
    }

    while (msb >= 7) {
        auto c = val.slice(msb, msb - 7).as<uint8_t>();
        if (c && *c)
            result.push_back(char(*c));
        msb -= 8;
    }

    return result;
}